

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall
Fl_Text_Display::line_end(Fl_Text_Display *this,int startPos,bool startPosIsLineStart)

{
  Fl_Text_Buffer *this_00;
  int iVar1;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  
  this_00 = this->mBuffer;
  if (this->mContinuousWrap != 0) {
    if (this_00->mLength != startPos) {
      wrapped_line_counter
                (this,this_00,startPos,this_00->mLength,1,startPosIsLineStart,0,&retPos,&retLines,
                 &retLineStart,&retLineEnd,true);
      startPos = retLineEnd;
    }
    return startPos;
  }
  iVar1 = Fl_Text_Buffer::line_end(this_00,startPos);
  return iVar1;
}

Assistant:

int Fl_Text_Display::line_end(int startPos, bool startPosIsLineStart) const {
  IS_UTF8_ALIGNED2(buffer(), startPos)

  int retLines, retPos, retLineStart, retLineEnd;

  /* If we're not wrapping use more efficient BufEndOfLine */
  if (!mContinuousWrap)
    return buffer()->line_end(startPos);

  if (startPos == buffer()->length())
    return startPos;

  wrapped_line_counter(buffer(), startPos, buffer()->length(), 1,
                       startPosIsLineStart, 0, &retPos, &retLines, &retLineStart,
                       &retLineEnd);

  IS_UTF8_ALIGNED2(buffer(), retLineEnd)
  return retLineEnd;
}